

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall testing::Matcher<const_long_&>::Matcher(Matcher<const_long_&> *this,long *value)

{
  MatcherBase<const_long_&> local_28;
  
  (this->super_MatcherBase<const_long_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_long_&>).buffer_.ptr = (void *)0x0;
  (this->super_MatcherBase<const_long_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_001ab7e8;
  local_28.buffer_.i = *value;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<long_const&>::
       GetVTable<testing::internal::MatcherBase<long_const&>::ValuePolicy<testing::internal::EqMatcher<long>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001ab7e8;
  internal::MatcherBase<const_long_&>::operator=(&this->super_MatcherBase<const_long_&>,&local_28);
  internal::MatcherBase<const_long_&>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}